

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined4 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  Scene *pSVar9;
  float **ppfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  int iVar27;
  undefined4 uVar28;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  long lVar30;
  byte bVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  float fVar38;
  uint uVar39;
  float fVar40;
  float fVar50;
  uint uVar51;
  float fVar53;
  uint uVar54;
  float fVar56;
  uint uVar57;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar52;
  float fVar55;
  float fVar58;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar49;
  float fVar59;
  int iVar60;
  float fVar65;
  int iVar66;
  float fVar67;
  int iVar68;
  vint4 bi;
  float fVar69;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar70;
  float fVar71;
  float fVar81;
  float fVar84;
  vint4 ai;
  uint uVar72;
  float fVar73;
  uint uVar82;
  uint uVar85;
  float fVar87;
  uint uVar88;
  StackItemT<embree::NodeRefPtr<4>_> SVar74;
  float fVar83;
  float fVar86;
  float fVar89;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar90;
  float fVar94;
  float fVar95;
  vint4 ai_1;
  StackItemT<embree::NodeRefPtr<4>_> SVar91;
  float fVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  vbool<4> valid;
  Scene *scene;
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [16];
  Geometry *local_11c8;
  ulong local_11c0;
  long local_11b8;
  undefined1 (*local_11b0) [16];
  long local_11a8;
  ulong local_11a0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1168;
  undefined8 uStack_1160;
  vfloat<4> tNear;
  float local_10f8 [4];
  float local_10e8 [4];
  float local_10d8 [4];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  float local_10a8 [4];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  int local_1088;
  int iStack_1084;
  int iStack_1080;
  int iStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float fVar99;
  
  pSVar29 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar117 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar99 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar115 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar118 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar136 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar73 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_11a0 = uVar35 ^ 0x10;
  iVar27 = (tray->tnear).field_0.i[k];
  iVar70 = (tray->tfar).field_0.i[k];
  local_11b0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1028 = fVar117;
  fStack_1024 = fVar117;
  fStack_1020 = fVar117;
  fStack_101c = fVar117;
  local_1038 = fVar99;
  fStack_1034 = fVar99;
  fStack_1030 = fVar99;
  fStack_102c = fVar99;
  local_1048 = fVar115;
  fStack_1044 = fVar115;
  fStack_1040 = fVar115;
  fStack_103c = fVar115;
  local_1058 = fVar118;
  fStack_1054 = fVar118;
  fStack_1050 = fVar118;
  fStack_104c = fVar118;
  local_1068 = fVar136;
  fStack_1064 = fVar136;
  fStack_1060 = fVar136;
  fStack_105c = fVar136;
  local_1078 = fVar73;
  fStack_1074 = fVar73;
  fStack_1070 = fVar73;
  fStack_106c = fVar73;
  local_1088 = iVar27;
  iStack_1084 = iVar27;
  iStack_1080 = iVar27;
  iStack_107c = iVar27;
  iVar68 = iVar70;
  iVar66 = iVar70;
  iVar60 = iVar70;
  iVar135 = iVar27;
  iVar134 = iVar27;
  iVar133 = iVar27;
  fVar96 = fVar73;
  fVar95 = fVar73;
  fVar94 = fVar73;
  fVar90 = fVar136;
  fVar69 = fVar136;
  fVar67 = fVar136;
  fVar65 = fVar118;
  fVar59 = fVar118;
  fVar58 = fVar118;
  fVar89 = fVar115;
  fVar142 = fVar115;
  fVar55 = fVar115;
  fVar86 = fVar99;
  fVar140 = fVar99;
  fVar52 = fVar99;
  fVar83 = fVar117;
  fVar138 = fVar117;
  fVar40 = fVar117;
LAB_00250b8b:
  do {
    pSVar26 = pSVar29 + -1;
    pSVar29 = pSVar29 + -1;
    if ((float)pSVar26->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar26->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar33 = (pSVar29->ptr).ptr;
      while ((uVar33 & 8) == 0) {
        pfVar4 = (float *)(uVar33 + 0x20 + uVar35);
        fVar38 = (*pfVar4 - fVar40) * fVar58;
        fVar50 = (pfVar4[1] - fVar138) * fVar59;
        fVar53 = (pfVar4[2] - fVar83) * fVar65;
        fVar56 = (pfVar4[3] - fVar117) * fVar118;
        pfVar4 = (float *)(uVar33 + 0x20 + uVar34);
        fVar71 = (*pfVar4 - fVar52) * fVar67;
        fVar81 = (pfVar4[1] - fVar140) * fVar69;
        fVar84 = (pfVar4[2] - fVar86) * fVar90;
        fVar87 = (pfVar4[3] - fVar99) * fVar136;
        uVar72 = (uint)((int)fVar71 < (int)fVar38) * (int)fVar38 |
                 (uint)((int)fVar71 >= (int)fVar38) * (int)fVar71;
        uVar82 = (uint)((int)fVar81 < (int)fVar50) * (int)fVar50 |
                 (uint)((int)fVar81 >= (int)fVar50) * (int)fVar81;
        uVar85 = (uint)((int)fVar84 < (int)fVar53) * (int)fVar53 |
                 (uint)((int)fVar84 >= (int)fVar53) * (int)fVar84;
        uVar88 = (uint)((int)fVar87 < (int)fVar56) * (int)fVar56 |
                 (uint)((int)fVar87 >= (int)fVar56) * (int)fVar87;
        pfVar4 = (float *)(uVar33 + 0x20 + uVar37);
        fVar38 = (*pfVar4 - fVar55) * fVar94;
        fVar50 = (pfVar4[1] - fVar142) * fVar95;
        fVar53 = (pfVar4[2] - fVar89) * fVar96;
        fVar56 = (pfVar4[3] - fVar115) * fVar73;
        uVar39 = (uint)((int)fVar38 < iVar133) * iVar133 |
                 (uint)((int)fVar38 >= iVar133) * (int)fVar38;
        uVar51 = (uint)((int)fVar50 < iVar134) * iVar134 |
                 (uint)((int)fVar50 >= iVar134) * (int)fVar50;
        uVar54 = (uint)((int)fVar53 < iVar135) * iVar135 |
                 (uint)((int)fVar53 >= iVar135) * (int)fVar53;
        uVar57 = (uint)((int)fVar56 < iVar27) * iVar27 | (uint)((int)fVar56 >= iVar27) * (int)fVar56
        ;
        tNear.field_0.i[0] =
             ((int)uVar39 < (int)uVar72) * uVar72 | ((int)uVar39 >= (int)uVar72) * uVar39;
        tNear.field_0.i[1] =
             ((int)uVar51 < (int)uVar82) * uVar82 | ((int)uVar51 >= (int)uVar82) * uVar51;
        tNear.field_0.i[2] =
             ((int)uVar54 < (int)uVar85) * uVar85 | ((int)uVar54 >= (int)uVar85) * uVar54;
        tNear.field_0.i[3] =
             ((int)uVar57 < (int)uVar88) * uVar88 | ((int)uVar57 >= (int)uVar88) * uVar57;
        pfVar4 = (float *)(uVar33 + 0x20 + local_11a0);
        fVar38 = (*pfVar4 - fVar40) * fVar58;
        fVar50 = (pfVar4[1] - fVar138) * fVar59;
        fVar53 = (pfVar4[2] - fVar83) * fVar65;
        fVar56 = (pfVar4[3] - fVar117) * fVar118;
        pfVar4 = (float *)(uVar33 + 0x20 + (uVar34 ^ 0x10));
        fVar71 = (*pfVar4 - fVar52) * fVar67;
        fVar81 = (pfVar4[1] - fVar140) * fVar69;
        fVar84 = (pfVar4[2] - fVar86) * fVar90;
        fVar87 = (pfVar4[3] - fVar99) * fVar136;
        uVar72 = (uint)((int)fVar38 < (int)fVar71) * (int)fVar38 |
                 (uint)((int)fVar38 >= (int)fVar71) * (int)fVar71;
        uVar82 = (uint)((int)fVar50 < (int)fVar81) * (int)fVar50 |
                 (uint)((int)fVar50 >= (int)fVar81) * (int)fVar81;
        uVar85 = (uint)((int)fVar53 < (int)fVar84) * (int)fVar53 |
                 (uint)((int)fVar53 >= (int)fVar84) * (int)fVar84;
        uVar88 = (uint)((int)fVar56 < (int)fVar87) * (int)fVar56 |
                 (uint)((int)fVar56 >= (int)fVar87) * (int)fVar87;
        pfVar4 = (float *)(uVar33 + 0x20 + (uVar37 ^ 0x10));
        fVar38 = (*pfVar4 - fVar55) * fVar94;
        fVar50 = (pfVar4[1] - fVar142) * fVar95;
        fVar53 = (pfVar4[2] - fVar89) * fVar96;
        fVar56 = (pfVar4[3] - fVar115) * fVar73;
        uVar39 = (uint)(iVar60 < (int)fVar38) * iVar60 | (uint)(iVar60 >= (int)fVar38) * (int)fVar38
        ;
        uVar51 = (uint)(iVar66 < (int)fVar50) * iVar66 | (uint)(iVar66 >= (int)fVar50) * (int)fVar50
        ;
        uVar54 = (uint)(iVar68 < (int)fVar53) * iVar68 | (uint)(iVar68 >= (int)fVar53) * (int)fVar53
        ;
        uVar57 = (uint)(iVar70 < (int)fVar56) * iVar70 | (uint)(iVar70 >= (int)fVar56) * (int)fVar56
        ;
        auVar76._0_4_ =
             -(uint)((int)(((int)uVar72 < (int)uVar39) * uVar72 |
                          ((int)uVar72 >= (int)uVar39) * uVar39) < tNear.field_0.i[0]);
        auVar76._4_4_ =
             -(uint)((int)(((int)uVar82 < (int)uVar51) * uVar82 |
                          ((int)uVar82 >= (int)uVar51) * uVar51) < tNear.field_0.i[1]);
        auVar76._8_4_ =
             -(uint)((int)(((int)uVar85 < (int)uVar54) * uVar85 |
                          ((int)uVar85 >= (int)uVar54) * uVar54) < tNear.field_0.i[2]);
        auVar76._12_4_ =
             -(uint)((int)(((int)uVar88 < (int)uVar57) * uVar88 |
                          ((int)uVar88 >= (int)uVar57) * uVar57) < tNear.field_0.i[3]);
        iVar32 = movmskps((int)local_11a0,auVar76);
        if (iVar32 == 0xf) {
          if (pSVar29 == stack) {
            return;
          }
          goto LAB_00250b8b;
        }
        bVar31 = (byte)iVar32 ^ 0xf;
        uVar36 = uVar33 & 0xfffffffffffffff0;
        lVar30 = 0;
        if (bVar31 != 0) {
          for (; (bVar31 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
          }
        }
        uVar33 = *(ulong *)(uVar36 + lVar30 * 8);
        uVar39 = bVar31 - 1 & (uint)bVar31;
        if (uVar39 != 0) {
          uVar51 = tNear.field_0.i[lVar30];
          lVar30 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar7 = *(ulong *)(uVar36 + lVar30 * 8);
          uVar54 = tNear.field_0.i[lVar30];
          uVar39 = uVar39 - 1 & uVar39;
          if (uVar39 == 0) {
            if (uVar51 < uVar54) {
              (pSVar29->ptr).ptr = uVar7;
              pSVar29->dist = uVar54;
              pSVar29 = pSVar29 + 1;
            }
            else {
              (pSVar29->ptr).ptr = uVar33;
              pSVar29->dist = uVar51;
              pSVar29 = pSVar29 + 1;
              uVar33 = uVar7;
            }
          }
          else {
            auVar77._8_4_ = uVar51;
            auVar77._0_8_ = uVar33;
            auVar77._12_4_ = 0;
            auVar102._8_4_ = uVar54;
            auVar102._0_8_ = uVar7;
            auVar102._12_4_ = 0;
            lVar30 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            uVar8 = *(undefined8 *)(uVar36 + lVar30 * 8);
            iVar32 = tNear.field_0.i[lVar30];
            auVar106._8_4_ = iVar32;
            auVar106._0_8_ = uVar8;
            auVar106._12_4_ = 0;
            auVar103._8_4_ = -(uint)((int)uVar51 < (int)uVar54);
            uVar39 = uVar39 - 1 & uVar39;
            if (uVar39 == 0) {
              auVar103._4_4_ = auVar103._8_4_;
              auVar103._0_4_ = auVar103._8_4_;
              auVar103._12_4_ = auVar103._8_4_;
              auVar100._8_4_ = uVar54;
              auVar100._0_8_ = uVar7;
              auVar100._12_4_ = 0;
              auVar101 = blendvps(auVar100,auVar77,auVar103);
              auVar76 = blendvps(auVar77,auVar102,auVar103);
              auVar41._8_4_ = -(uint)(auVar101._8_4_ < iVar32);
              auVar41._4_4_ = auVar41._8_4_;
              auVar41._0_4_ = auVar41._8_4_;
              auVar41._12_4_ = auVar41._8_4_;
              auVar97._8_4_ = iVar32;
              auVar97._0_8_ = uVar8;
              auVar97._12_4_ = 0;
              auVar77 = blendvps(auVar97,auVar101,auVar41);
              auVar102 = blendvps(auVar101,auVar106,auVar41);
              auVar42._8_4_ = -(uint)(auVar76._8_4_ < auVar102._8_4_);
              auVar42._4_4_ = auVar42._8_4_;
              auVar42._0_4_ = auVar42._8_4_;
              auVar42._12_4_ = auVar42._8_4_;
              SVar91 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar102,auVar76,auVar42);
              SVar74 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar76,auVar102,auVar42);
              *pSVar29 = SVar74;
              pSVar29[1] = SVar91;
              uVar33 = auVar77._0_8_;
              pSVar29 = pSVar29 + 2;
            }
            else {
              lVar30 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              auVar101._4_4_ = auVar103._8_4_;
              auVar101._0_4_ = auVar103._8_4_;
              auVar101._8_4_ = auVar103._8_4_;
              auVar101._12_4_ = auVar103._8_4_;
              auVar103 = blendvps(auVar102,auVar77,auVar101);
              auVar76 = blendvps(auVar77,auVar102,auVar101);
              auVar105._8_4_ = tNear.field_0.i[lVar30];
              auVar105._0_8_ = *(undefined8 *)(uVar36 + lVar30 * 8);
              auVar105._12_4_ = 0;
              auVar43._8_4_ = -(uint)(iVar32 < tNear.field_0.i[lVar30]);
              auVar43._4_4_ = auVar43._8_4_;
              auVar43._0_4_ = auVar43._8_4_;
              auVar43._12_4_ = auVar43._8_4_;
              auVar102 = blendvps(auVar105,auVar106,auVar43);
              auVar77 = blendvps(auVar106,auVar105,auVar43);
              auVar44._8_4_ = -(uint)(auVar76._8_4_ < auVar77._8_4_);
              auVar44._4_4_ = auVar44._8_4_;
              auVar44._0_4_ = auVar44._8_4_;
              auVar44._12_4_ = auVar44._8_4_;
              auVar106 = blendvps(auVar77,auVar76,auVar44);
              SVar74 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar76,auVar77,auVar44);
              auVar45._8_4_ = -(uint)(auVar103._8_4_ < auVar102._8_4_);
              auVar45._4_4_ = auVar45._8_4_;
              auVar45._0_4_ = auVar45._8_4_;
              auVar45._12_4_ = auVar45._8_4_;
              auVar76 = blendvps(auVar102,auVar103,auVar45);
              auVar77 = blendvps(auVar103,auVar102,auVar45);
              auVar46._8_4_ = -(uint)(auVar77._8_4_ < auVar106._8_4_);
              auVar46._4_4_ = auVar46._8_4_;
              auVar46._0_4_ = auVar46._8_4_;
              auVar46._12_4_ = auVar46._8_4_;
              SVar91 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar106,auVar77,auVar46);
              SVar104 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar77,auVar106,auVar46);
              *pSVar29 = SVar74;
              pSVar29[1] = SVar104;
              pSVar29[2] = SVar91;
              uVar33 = auVar76._0_8_;
              pSVar29 = pSVar29 + 3;
            }
          }
        }
      }
      local_11a8 = (ulong)((uint)uVar33 & 0xf) - 8;
      if (local_11a8 != 0) {
        uVar33 = uVar33 & 0xfffffffffffffff0;
        local_11b8 = 0;
        do {
          lVar30 = local_11b8 * 0x50;
          pSVar9 = context->scene;
          ppfVar10 = (pSVar9->vertices).items;
          pfVar11 = ppfVar10[*(uint *)(uVar33 + 0x30 + lVar30)];
          pfVar4 = pfVar11 + *(uint *)(uVar33 + lVar30);
          fVar136 = *pfVar4;
          fVar73 = pfVar4[1];
          fVar40 = pfVar4[2];
          pfVar4 = pfVar11 + *(uint *)(uVar33 + 0x10 + lVar30);
          pfVar11 = pfVar11 + *(uint *)(uVar33 + 0x20 + lVar30);
          pfVar12 = ppfVar10[*(uint *)(uVar33 + 0x34 + lVar30)];
          pfVar1 = pfVar12 + *(uint *)(uVar33 + 4 + lVar30);
          fVar138 = *pfVar1;
          fVar83 = pfVar1[1];
          fVar52 = pfVar1[2];
          pfVar1 = pfVar12 + *(uint *)(uVar33 + 0x14 + lVar30);
          pfVar12 = pfVar12 + *(uint *)(uVar33 + 0x24 + lVar30);
          pfVar13 = ppfVar10[*(uint *)(uVar33 + 0x38 + lVar30)];
          pfVar2 = pfVar13 + *(uint *)(uVar33 + 8 + lVar30);
          fVar140 = *pfVar2;
          fVar86 = pfVar2[1];
          fVar55 = pfVar2[2];
          pfVar2 = pfVar13 + *(uint *)(uVar33 + 0x18 + lVar30);
          pfVar13 = pfVar13 + *(uint *)(uVar33 + 0x28 + lVar30);
          pfVar14 = ppfVar10[*(uint *)(uVar33 + 0x3c + lVar30)];
          pfVar3 = pfVar14 + *(uint *)(uVar33 + 0xc + lVar30);
          fVar142 = *pfVar3;
          fVar89 = pfVar3[1];
          fVar58 = pfVar3[2];
          pfVar3 = pfVar14 + *(uint *)(uVar33 + 0x1c + lVar30);
          pfVar14 = pfVar14 + *(uint *)(uVar33 + 0x2c + lVar30);
          puVar5 = (undefined8 *)(uVar33 + 0x30 + lVar30);
          local_1018 = *puVar5;
          uStack_1010 = puVar5[1];
          puVar5 = (undefined8 *)(uVar33 + 0x40 + lVar30);
          local_1168 = *puVar5;
          uStack_1160 = puVar5[1];
          fVar108 = fVar136 - *pfVar4;
          fVar109 = fVar138 - *pfVar1;
          fVar110 = fVar140 - *pfVar2;
          fVar111 = fVar142 - *pfVar3;
          fVar116 = fVar73 - pfVar4[1];
          fVar119 = fVar83 - pfVar1[1];
          fVar121 = fVar86 - pfVar2[1];
          fVar123 = fVar89 - pfVar3[1];
          fVar125 = fVar40 - pfVar4[2];
          fVar126 = fVar52 - pfVar1[2];
          fVar127 = fVar55 - pfVar2[2];
          fVar128 = fVar58 - pfVar3[2];
          fVar59 = *pfVar11 - fVar136;
          fVar65 = *pfVar12 - fVar138;
          fVar67 = *pfVar13 - fVar140;
          fVar69 = *pfVar14 - fVar142;
          fVar71 = pfVar11[1] - fVar73;
          fVar81 = pfVar12[1] - fVar83;
          fVar84 = pfVar13[1] - fVar86;
          fVar87 = pfVar14[1] - fVar89;
          fVar38 = pfVar11[2] - fVar40;
          fVar50 = pfVar12[2] - fVar52;
          fVar53 = pfVar13[2] - fVar55;
          fVar56 = pfVar14[2] - fVar58;
          fVar90 = fVar125 * fVar71 - fVar116 * fVar38;
          fVar94 = fVar126 * fVar81 - fVar119 * fVar50;
          local_10c8._4_4_ = fVar94;
          local_10c8._0_4_ = fVar90;
          fVar95 = fVar127 * fVar84 - fVar121 * fVar53;
          fVar96 = fVar128 * fVar87 - fVar123 * fVar56;
          fVar117 = *(float *)(ray + k * 4);
          fVar99 = *(float *)(ray + k * 4 + 0x10);
          fVar115 = *(float *)(ray + k * 4 + 0x40);
          fVar118 = *(float *)(ray + k * 4 + 0x50);
          fVar136 = fVar136 - fVar117;
          fVar138 = fVar138 - fVar117;
          fVar140 = fVar140 - fVar117;
          fVar142 = fVar142 - fVar117;
          fVar73 = fVar73 - fVar99;
          fVar83 = fVar83 - fVar99;
          fVar86 = fVar86 - fVar99;
          fVar89 = fVar89 - fVar99;
          fVar129 = fVar136 * fVar118 - fVar73 * fVar115;
          fVar130 = fVar138 * fVar118 - fVar83 * fVar115;
          fVar131 = fVar140 * fVar118 - fVar86 * fVar115;
          fVar132 = fVar142 * fVar118 - fVar89 * fVar115;
          local_10b8._0_4_ = fVar108 * fVar38 - fVar125 * fVar59;
          local_10b8._4_4_ = fVar109 * fVar50 - fVar126 * fVar65;
          local_10b8._8_4_ = fVar110 * fVar53 - fVar127 * fVar67;
          local_10b8._12_4_ = fVar111 * fVar56 - fVar128 * fVar69;
          fVar117 = *(float *)(ray + k * 4 + 0x20);
          fVar99 = *(float *)(ray + k * 4 + 0x60);
          fVar40 = fVar40 - fVar117;
          fVar52 = fVar52 - fVar117;
          fVar55 = fVar55 - fVar117;
          fVar58 = fVar58 - fVar117;
          fVar137 = fVar40 * fVar115 - fVar136 * fVar99;
          fVar139 = fVar52 * fVar115 - fVar138 * fVar99;
          fVar141 = fVar55 * fVar115 - fVar140 * fVar99;
          fVar143 = fVar58 * fVar115 - fVar142 * fVar99;
          local_10a8[0] = fVar116 * fVar59 - fVar108 * fVar71;
          local_10a8[1] = fVar119 * fVar65 - fVar109 * fVar81;
          local_10a8[2] = fVar121 * fVar67 - fVar110 * fVar84;
          local_10a8[3] = fVar123 * fVar69 - fVar111 * fVar87;
          fVar117 = fVar73 * fVar99 - fVar40 * fVar118;
          fVar120 = fVar83 * fVar99 - fVar52 * fVar118;
          fVar122 = fVar86 * fVar99 - fVar55 * fVar118;
          fVar124 = fVar89 * fVar99 - fVar58 * fVar118;
          fVar112 = fVar115 * fVar90 + fVar118 * local_10b8._0_4_ + fVar99 * local_10a8[0];
          fVar113 = fVar115 * fVar94 + fVar118 * local_10b8._4_4_ + fVar99 * local_10a8[1];
          fVar114 = fVar115 * fVar95 + fVar118 * local_10b8._8_4_ + fVar99 * local_10a8[2];
          fVar115 = fVar115 * fVar96 + fVar118 * local_10b8._12_4_ + fVar99 * local_10a8[3];
          uVar39 = (uint)fVar112 & 0x80000000;
          uVar51 = (uint)fVar113 & 0x80000000;
          uVar54 = (uint)fVar114 & 0x80000000;
          uVar57 = (uint)fVar115 & 0x80000000;
          tNear.field_0.i[0] =
               (uint)(fVar59 * fVar117 + fVar71 * fVar137 + fVar38 * fVar129) ^ uVar39;
          tNear.field_0.i[1] =
               (uint)(fVar65 * fVar120 + fVar81 * fVar139 + fVar50 * fVar130) ^ uVar51;
          tNear.field_0.i[2] =
               (uint)(fVar67 * fVar122 + fVar84 * fVar141 + fVar53 * fVar131) ^ uVar54;
          tNear.field_0.i[3] =
               (uint)(fVar69 * fVar124 + fVar87 * fVar143 + fVar56 * fVar132) ^ uVar57;
          fVar118 = (float)((uint)(fVar117 * fVar108 + fVar137 * fVar116 + fVar129 * fVar125) ^
                           uVar39);
          fVar59 = (float)((uint)(fVar120 * fVar109 + fVar139 * fVar119 + fVar130 * fVar126) ^
                          uVar51);
          fVar65 = (float)((uint)(fVar122 * fVar110 + fVar141 * fVar121 + fVar131 * fVar127) ^
                          uVar54);
          fVar67 = (float)((uint)(fVar124 * fVar111 + fVar143 * fVar123 + fVar132 * fVar128) ^
                          uVar57);
          fVar117 = ABS(fVar112);
          fVar99 = ABS(fVar113);
          auVar98._0_8_ = CONCAT44(fVar113,fVar112) & 0x7fffffff7fffffff;
          auVar98._8_4_ = ABS(fVar114);
          auVar98._12_4_ = ABS(fVar115);
          bVar23 = ((0.0 <= fVar118 && 0.0 <= tNear.field_0.v[0]) && fVar112 != 0.0) &&
                   tNear.field_0.v[0] + fVar118 <= fVar117;
          auVar107._0_4_ = -(uint)bVar23;
          bVar25 = ((0.0 <= fVar59 && 0.0 <= tNear.field_0.v[1]) && fVar113 != 0.0) &&
                   tNear.field_0.v[1] + fVar59 <= fVar99;
          auVar107._4_4_ = -(uint)bVar25;
          bVar24 = ((0.0 <= fVar65 && 0.0 <= tNear.field_0.v[2]) && fVar114 != 0.0) &&
                   tNear.field_0.v[2] + fVar65 <= auVar98._8_4_;
          auVar107._8_4_ = -(uint)bVar24;
          bVar22 = ((0.0 <= fVar67 && 0.0 <= tNear.field_0.v[3]) && fVar115 != 0.0) &&
                   tNear.field_0.v[3] + fVar67 <= auVar98._12_4_;
          auVar107._12_4_ = -(uint)bVar22;
          iVar27 = movmskps((int)lVar30,auVar107);
          if (iVar27 != 0) {
            fVar136 = (float)(uVar39 ^ (uint)(fVar136 * fVar90 +
                                             fVar73 * local_10b8._0_4_ + fVar40 * local_10a8[0]));
            fVar73 = (float)(uVar51 ^ (uint)(fVar138 * fVar94 +
                                            fVar83 * local_10b8._4_4_ + fVar52 * local_10a8[1]));
            fVar40 = (float)(uVar54 ^ (uint)(fVar140 * fVar95 +
                                            fVar86 * local_10b8._8_4_ + fVar55 * local_10a8[2]));
            fVar138 = (float)(uVar57 ^ (uint)(fVar142 * fVar96 +
                                             fVar89 * local_10b8._12_4_ + fVar58 * local_10a8[3]));
            fVar115 = *(float *)(ray + k * 4 + 0x30);
            bVar16 = fVar115 * fVar117 < fVar136;
            bVar17 = fVar115 * fVar99 < fVar73;
            bVar18 = fVar115 * auVar98._8_4_ < fVar40;
            bVar19 = fVar115 * auVar98._12_4_ < fVar138;
            auVar75._4_4_ = -(uint)bVar17;
            auVar75._0_4_ = -(uint)bVar16;
            auVar75._8_4_ = -(uint)bVar18;
            auVar75._12_4_ = -(uint)bVar19;
            local_11e8._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
            local_11e8._4_4_ = 0;
            local_11e8._8_4_ = 0;
            local_11e8._12_4_ = 0;
            valid.field_0.i[0] =
                 -(uint)((fVar136 <= (float)local_11e8._0_4_ * fVar117 && bVar16) && bVar23);
            valid.field_0.i[1] =
                 -(uint)((fVar73 <= (float)local_11e8._0_4_ * fVar99 && bVar17) && bVar25);
            valid.field_0.i[2] =
                 -(uint)((fVar40 <= (float)local_11e8._0_4_ * auVar98._8_4_ && bVar18) && bVar24);
            valid.field_0.i[3] =
                 -(uint)((fVar138 <= (float)local_11e8._0_4_ * auVar98._12_4_ && bVar19) && bVar22);
            iVar27 = movmskps(iVar27,(undefined1  [16])valid.field_0);
            if (iVar27 != 0) {
              local_10c8._8_4_ = fVar95;
              local_10c8._12_4_ = fVar96;
              auVar76 = rcpps(auVar75,auVar98);
              fVar115 = auVar76._0_4_;
              fVar83 = auVar76._4_4_;
              fVar52 = auVar76._8_4_;
              fVar140 = auVar76._12_4_;
              fVar115 = (1.0 - fVar117 * fVar115) * fVar115 + fVar115;
              fVar83 = (1.0 - fVar99 * fVar83) * fVar83 + fVar83;
              fVar52 = (1.0 - auVar98._8_4_ * fVar52) * fVar52 + fVar52;
              fVar140 = (1.0 - auVar98._12_4_ * fVar140) * fVar140 + fVar140;
              fVar136 = fVar136 * fVar115;
              fVar73 = fVar73 * fVar83;
              fVar40 = fVar40 * fVar52;
              fVar138 = fVar138 * fVar140;
              local_10d8[0] = fVar136;
              local_10d8[1] = fVar73;
              local_10d8[2] = fVar40;
              local_10d8[3] = fVar138;
              local_10f8[0] = tNear.field_0.v[0] * fVar115;
              local_10f8[1] = tNear.field_0.v[1] * fVar83;
              local_10f8[2] = tNear.field_0.v[2] * fVar52;
              local_10f8[3] = tNear.field_0.v[3] * fVar140;
              local_10e8[0] = fVar115 * fVar118;
              local_10e8[1] = fVar83 * fVar59;
              local_10e8[2] = fVar52 * fVar65;
              local_10e8[3] = fVar140 * fVar67;
              auVar20._4_4_ = fVar73;
              auVar20._0_4_ = fVar136;
              auVar20._8_4_ = fVar40;
              auVar20._12_4_ = fVar138;
              auVar77 = blendvps(_DAT_01f7a9f0,auVar20,(undefined1  [16])valid.field_0);
              auVar92._4_4_ = auVar77._0_4_;
              auVar92._0_4_ = auVar77._4_4_;
              auVar92._8_4_ = auVar77._12_4_;
              auVar92._12_4_ = auVar77._8_4_;
              auVar76 = minps(auVar92,auVar77);
              auVar61._0_8_ = auVar76._8_8_;
              auVar61._8_4_ = auVar76._0_4_;
              auVar61._12_4_ = auVar76._4_4_;
              auVar76 = minps(auVar61,auVar76);
              uVar39 = -(uint)(auVar76._0_4_ == auVar77._0_4_);
              uVar51 = -(uint)(auVar76._4_4_ == auVar77._4_4_);
              uVar54 = -(uint)(auVar76._8_4_ == auVar77._8_4_);
              uVar57 = -(uint)(auVar76._12_4_ == auVar77._12_4_);
              auVar80._4_4_ = uVar51;
              auVar80._0_4_ = uVar39;
              auVar78._0_4_ = uVar39 & valid.field_0.i[0];
              auVar78._4_4_ = uVar51 & valid.field_0.i[1];
              auVar78._8_4_ = uVar54 & valid.field_0.i[2];
              auVar78._12_4_ = uVar57 & valid.field_0.i[3];
              iVar27 = movmskps(iVar27,auVar78);
              auVar79._8_4_ = 0xffffffff;
              auVar79._0_8_ = 0xffffffffffffffff;
              auVar79._12_4_ = 0xffffffff;
              if (iVar27 != 0) {
                auVar80._8_4_ = uVar54;
                auVar80._12_4_ = uVar57;
                auVar79 = auVar80;
              }
              auVar47._0_4_ = valid.field_0.i[0] & auVar79._0_4_;
              auVar47._4_4_ = valid.field_0.i[1] & auVar79._4_4_;
              auVar47._8_4_ = valid.field_0.i[2] & auVar79._8_4_;
              auVar47._12_4_ = valid.field_0.i[3] & auVar79._12_4_;
              uVar28 = movmskps(iVar27,auVar47);
              uVar36 = CONCAT44((int)((ulong)lVar30 >> 0x20),uVar28);
              local_11c0 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> local_11c0 & 1) == 0; local_11c0 = local_11c0 + 1) {
                }
              }
LAB_00251244:
              uVar39 = *(uint *)((long)&local_1018 + local_11c0 * 4);
              uVar36 = (ulong)uVar39;
              local_11c8 = (pSVar9->geometries).items[uVar36].ptr;
              if ((local_11c8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                valid.field_0.v[local_11c0] = 0.0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_11c8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar117 = local_10f8[local_11c0];
                  fVar99 = local_10e8[local_11c0];
                  *(float *)(ray + k * 4 + 0x80) = local_10d8[local_11c0];
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10c8 + local_11c0 * 4)
                  ;
                  *(float *)(ray + k * 4 + 0xd0) = local_10a8[local_11c0 - 4];
                  *(float *)(ray + k * 4 + 0xe0) = local_10a8[local_11c0];
                  *(float *)(ray + k * 4 + 0xf0) = fVar117;
                  *(float *)(ray + k * 4 + 0x100) = fVar99;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)((long)&local_1168 + local_11c0 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar39;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_002510fe;
                }
                local_1098 = fVar136;
                fStack_1094 = fVar73;
                fStack_1090 = fVar40;
                fStack_108c = fVar138;
                h.u.field_0.v[0] = local_10f8[local_11c0];
                h.v.field_0.v[0] = local_10e8[local_11c0];
                uVar28 = *(undefined4 *)(local_10c8 + local_11c0 * 4);
                fVar117 = local_10a8[local_11c0 - 4];
                h.geomID.field_0.i[1] = uVar39;
                h.geomID.field_0.i[0] = uVar39;
                h.geomID.field_0.i[2] = uVar39;
                h.geomID.field_0.i[3] = uVar39;
                uVar6 = *(undefined4 *)((long)&local_1168 + local_11c0 * 4);
                h.primID.field_0.i[1] = uVar6;
                h.primID.field_0.i[0] = uVar6;
                h.primID.field_0.i[2] = uVar6;
                h.primID.field_0.i[3] = uVar6;
                h.Ng.field_0._4_4_ = uVar28;
                h.Ng.field_0._0_4_ = uVar28;
                h.Ng.field_0._8_4_ = uVar28;
                h.Ng.field_0._12_4_ = uVar28;
                h.Ng.field_0._20_4_ = (int)fVar117;
                h.Ng.field_0._16_4_ = (int)fVar117;
                h.Ng.field_0._24_4_ = (int)fVar117;
                h.Ng.field_0._28_4_ = (int)fVar117;
                fVar117 = local_10a8[local_11c0];
                h.Ng.field_0._36_4_ = (int)fVar117;
                h.Ng.field_0._32_4_ = (int)fVar117;
                h.Ng.field_0._40_4_ = (int)fVar117;
                h.Ng.field_0._44_4_ = (int)fVar117;
                h.u.field_0.v[1] = h.u.field_0.v[0];
                h.u.field_0.v[2] = h.u.field_0.v[0];
                h.u.field_0.v[3] = h.u.field_0.v[0];
                h.v.field_0.v[1] = h.v.field_0.v[0];
                h.v.field_0.v[2] = h.v.field_0.v[0];
                h.v.field_0.v[3] = h.v.field_0.v[0];
                h.instID[0].field_0.i[0] = context->user->instID[0];
                h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                *(float *)(ray + k * 4 + 0x80) = local_10d8[local_11c0];
                local_11d8 = *local_11b0;
                args.valid = (int *)local_11d8;
                args.geometryUserPtr = local_11c8->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&h;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (local_11c8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_11c8->intersectionFilterN)(&args);
                }
                if (local_11d8 == (undefined1  [16])0x0) {
                  auVar62._8_4_ = 0xffffffff;
                  auVar62._0_8_ = 0xffffffffffffffff;
                  auVar62._12_4_ = 0xffffffff;
                  auVar62 = auVar62 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_11c8->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var15)(&args);
                  }
                  auVar48._0_4_ = -(uint)(local_11d8._0_4_ == 0);
                  auVar48._4_4_ = -(uint)(local_11d8._4_4_ == 0);
                  auVar48._8_4_ = -(uint)(local_11d8._8_4_ == 0);
                  auVar48._12_4_ = -(uint)(local_11d8._12_4_ == 0);
                  auVar62 = auVar48 ^ _DAT_01f7ae20;
                  if (local_11d8 != (undefined1  [16])0x0) {
                    auVar76 = blendvps(*(undefined1 (*) [16])args.hit,
                                       *(undefined1 (*) [16])(args.ray + 0xc0),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0xc0) = auVar76;
                    auVar76 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                       *(undefined1 (*) [16])(args.ray + 0xd0),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0xd0) = auVar76;
                    auVar76 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                       *(undefined1 (*) [16])(args.ray + 0xe0),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0xe0) = auVar76;
                    auVar76 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                       *(undefined1 (*) [16])(args.ray + 0xf0),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0xf0) = auVar76;
                    auVar76 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                       *(undefined1 (*) [16])(args.ray + 0x100),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0x100) = auVar76;
                    auVar76 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                       *(undefined1 (*) [16])(args.ray + 0x110),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0x110) = auVar76;
                    auVar76 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                       *(undefined1 (*) [16])(args.ray + 0x120),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0x120) = auVar76;
                    auVar76 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                       *(undefined1 (*) [16])(args.ray + 0x130),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0x130) = auVar76;
                    auVar76 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                       *(undefined1 (*) [16])(args.ray + 0x140),auVar48);
                    *(undefined1 (*) [16])(args.ray + 0x140) = auVar76;
                  }
                }
                if ((_DAT_01f7bb20 & auVar62) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_11e8._0_4_;
                }
                else {
                  local_11e8 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                valid.field_0.v[local_11c0] = 0.0;
                valid.field_0.i[0] =
                     -(uint)(local_1098 <= (float)local_11e8._0_4_) & valid.field_0.i[0];
                valid.field_0.i[1] =
                     -(uint)(fStack_1094 <= (float)local_11e8._0_4_) & valid.field_0.i[1];
                valid.field_0.i[2] =
                     -(uint)(fStack_1090 <= (float)local_11e8._0_4_) & valid.field_0.i[2];
                valid.field_0.i[3] =
                     -(uint)(fStack_108c <= (float)local_11e8._0_4_) & valid.field_0.i[3];
                uVar36 = local_11c0;
                fVar136 = local_1098;
                fVar73 = fStack_1094;
                fVar40 = fStack_1090;
                fVar138 = fStack_108c;
              }
              iVar27 = movmskps((int)uVar36,(undefined1  [16])valid.field_0);
              if (iVar27 == 0) goto LAB_002510fe;
              auVar21._4_4_ = fVar73;
              auVar21._0_4_ = fVar136;
              auVar21._8_4_ = fVar40;
              auVar21._12_4_ = fVar138;
              auVar77 = blendvps(_DAT_01f7a9f0,auVar21,(undefined1  [16])valid.field_0);
              auVar93._4_4_ = auVar77._0_4_;
              auVar93._0_4_ = auVar77._4_4_;
              auVar93._8_4_ = auVar77._12_4_;
              auVar93._12_4_ = auVar77._8_4_;
              auVar76 = minps(auVar93,auVar77);
              auVar63._0_8_ = auVar76._8_8_;
              auVar63._8_4_ = auVar76._0_4_;
              auVar63._12_4_ = auVar76._4_4_;
              auVar76 = minps(auVar63,auVar76);
              auVar64._0_8_ =
                   CONCAT44(-(uint)(auVar76._4_4_ == auVar77._4_4_) & valid.field_0._4_4_,
                            -(uint)(auVar76._0_4_ == auVar77._0_4_) & valid.field_0._0_4_);
              auVar64._8_4_ = -(uint)(auVar76._8_4_ == auVar77._8_4_) & valid.field_0._8_4_;
              auVar64._12_4_ = -(uint)(auVar76._12_4_ == auVar77._12_4_) & valid.field_0._12_4_;
              iVar27 = movmskps(iVar27,auVar64);
              aVar49 = valid.field_0;
              if (iVar27 != 0) {
                aVar49.i[2] = auVar64._8_4_;
                aVar49._0_8_ = auVar64._0_8_;
                aVar49.i[3] = auVar64._12_4_;
              }
              uVar28 = movmskps(iVar27,(undefined1  [16])aVar49);
              uVar36 = CONCAT44((int)(uVar36 >> 0x20),uVar28);
              local_11c0 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> local_11c0 & 1) == 0; local_11c0 = local_11c0 + 1) {
                }
              }
              goto LAB_00251244;
            }
          }
LAB_002510fe:
          local_11b8 = local_11b8 + 1;
        } while (local_11b8 != local_11a8);
      }
      iVar60 = *(int *)(ray + k * 4 + 0x80);
      fVar40 = local_1028;
      fVar138 = fStack_1024;
      fVar83 = fStack_1020;
      fVar117 = fStack_101c;
      fVar52 = local_1038;
      fVar140 = fStack_1034;
      fVar86 = fStack_1030;
      fVar99 = fStack_102c;
      fVar55 = local_1048;
      fVar142 = fStack_1044;
      fVar89 = fStack_1040;
      fVar115 = fStack_103c;
      fVar58 = local_1058;
      fVar59 = fStack_1054;
      fVar65 = fStack_1050;
      fVar118 = fStack_104c;
      fVar67 = local_1068;
      fVar69 = fStack_1064;
      fVar90 = fStack_1060;
      fVar136 = fStack_105c;
      fVar94 = local_1078;
      fVar95 = fStack_1074;
      fVar96 = fStack_1070;
      fVar73 = fStack_106c;
      iVar133 = local_1088;
      iVar134 = iStack_1084;
      iVar135 = iStack_1080;
      iVar27 = iStack_107c;
      iVar66 = iVar60;
      iVar68 = iVar60;
      iVar70 = iVar60;
    }
    if (pSVar29 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }